

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool google::protobuf::ExistingFileMatchesProto
               (Edition edition,FileDescriptor *existing_file,FileDescriptorProto *proto)

{
  __type _Var1;
  FileDescriptorProto existing_proto;
  string sStack_158;
  string local_138;
  undefined1 local_118 [248];
  
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_118);
  FileDescriptor::CopyTo(existing_file,(FileDescriptorProto *)local_118);
  if ((edition == EDITION_PROTO2) &&
     ((undefined1  [232])((undefined1  [232])proto->field_0 & (undefined1  [232])0x4) !=
      (undefined1  [232])0x0)) {
    local_118[0x10] = local_118[0x10] | 4;
    if ((local_118._8_8_ & 1) != 0) {
      local_118._8_8_ = *(undefined8 *)(local_118._8_8_ & 0xfffffffffffffffe);
    }
    internal::ArenaStringPtr::Set
              ((ArenaStringPtr *)(local_118 + 0xd8),"proto2",(Arena *)local_118._8_8_);
  }
  MessageLite::SerializeAsString_abi_cxx11_(&sStack_158,(MessageLite *)local_118);
  MessageLite::SerializeAsString_abi_cxx11_(&local_138,(MessageLite *)proto);
  _Var1 = std::operator==(&sStack_158,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&sStack_158);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_118);
  return _Var1;
}

Assistant:

PROTOBUF_NOINLINE static bool ExistingFileMatchesProto(
    Edition edition, const FileDescriptor* existing_file,
    const FileDescriptorProto& proto) {
  FileDescriptorProto existing_proto;
  existing_file->CopyTo(&existing_proto);
  if (edition == Edition::EDITION_PROTO2 && proto.has_syntax()) {
    existing_proto.set_syntax("proto2");
  }

  return existing_proto.SerializeAsString() == proto.SerializeAsString();
}